

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int32_t zng_inflateSetDictionary(zng_stream *strm,uint8_t *dictionary,uint32_t dictLength)

{
  internal_state *piVar1;
  ulong uVar2;
  int iVar3;
  uint32_t uVar4;
  int32_t iVar5;
  
  iVar3 = inflateStateCheck(strm);
  iVar5 = -2;
  if ((iVar3 == 0) &&
     ((piVar1 = strm->state, *(int *)&piVar1->pending_out == 0 ||
      (*(int *)&piVar1->pending_buf == 0x3f3e)))) {
    if ((*(int *)&piVar1->pending_buf == 0x3f3e) &&
       (uVar4 = (*functable.adler32)(1,dictionary,(ulong)dictLength), uVar2._0_4_ = piVar1->wrap,
       uVar2._4_4_ = piVar1->gzindex, uVar2 != uVar4)) {
      return -3;
    }
    iVar5 = 0;
    updatewindow(strm,dictionary + dictLength,dictLength,0);
    *(undefined4 *)((long)&piVar1->pending_out + 4) = 1;
  }
  return iVar5;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateSetDictionary)(PREFIX3(stream) *strm, const uint8_t *dictionary, uint32_t dictLength) {
    struct inflate_state *state;
    unsigned long dictid;

    /* check state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if (state->wrap != 0 && state->mode != DICT)
        return Z_STREAM_ERROR;

    /* check for correct dictionary identifier */
    if (state->mode == DICT) {
        dictid = FUNCTABLE_CALL(adler32)(ADLER32_INITIAL_VALUE, dictionary, dictLength);
        if (dictid != state->check)
            return Z_DATA_ERROR;
    }

    INFLATE_SET_DICTIONARY_HOOK(strm, dictionary, dictLength);  /* hook for IBM Z DFLTCC */

    /* copy dictionary to window using updatewindow(), which will amend the
       existing dictionary if appropriate */
    updatewindow(strm, dictionary + dictLength, dictLength, 0);

    state->havedict = 1;
    Tracev((stderr, "inflate:   dictionary set\n"));
    return Z_OK;
}